

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_value<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
          (result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc,size_t n_rec)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  bool bVar1;
  error_type *this_01;
  value_type *pvVar2;
  location *loc_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  location *loc_01;
  result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt;
  result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_00;
  result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_01;
  result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_02;
  result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_03;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_04;
  result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_05;
  result<std::pair<toml::local_time,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_06;
  result<std::pair<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_07;
  result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_01;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_810;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_7a0;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_770;
  char *local_750;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_748;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_72a;
  undefined1 local_729;
  source_location local_728;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_6d8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6d0;
  iterator local_660;
  size_type local_658;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_650;
  allocator<char> local_631;
  string local_630;
  undefined1 local_610 [8];
  string msg;
  result<std::pair<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_568;
  result<std::pair<toml::local_time,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_500;
  result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  undefined4 local_204;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  undefined1 local_1e0 [8];
  result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  type;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_19a;
  undefined1 local_199;
  source_location local_198;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_148;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  iterator local_d0;
  size_type local_c8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  allocator<char> local_91;
  string local_90;
  string local_70;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_50
  ;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  size_t n_rec_local;
  location *loc_local;
  
  first._M_current = (char *)loc;
  local_28._M_current = (char *)location::iter((location *)this);
  local_30._M_current = (char *)location::end((location *)this);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"toml::parse_value: input is empty",&local_91);
    local_199 = 1;
    local_148 = &local_140;
    source_location::source_location(&local_198,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[1],_true>
              (&local_140,&local_198,(char (*) [1])0x2f9209);
    local_199 = 0;
    local_d0 = &local_140;
    local_c8 = 1;
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_19a);
    __l_00._M_len = local_c8;
    __l_00._M_array = local_d0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_c0,__l_00,&local_19a);
    type.field_1._24_8_ = 0;
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&type.field_1.fail.value.field_2 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00);
    format_underline(&local_70,&local_90,&local_c0,this_00,false);
    err<std::__cxx11::string>(&local_50,(toml *)&local_70,v);
    result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_50);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&type.field_1.fail.value.field_2 + 8));
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_c0);
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_19a);
    local_7a0 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_d0;
    do {
      local_7a0 = local_7a0 + -1;
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_7a0);
    } while (local_7a0 != &local_140);
    source_location::~source_location(&local_198);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  else {
    guess_value_type_abi_cxx11_
              ((result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e0,this,loc_00);
    bVar1 = toml::result::operator_cast_to_bool((result *)local_1e0);
    if (bVar1) {
      pvVar2 = result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::unwrap((result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_1e0);
      switch(*pvVar2) {
      case boolean:
        parse_boolean_abi_cxx11_(&local_260,this,loc_01);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,bool>
                  (__return_storage_ptr__,(detail *)&local_260,rslt);
        result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result(&local_260);
        local_204 = 1;
        break;
      case integer:
        parse_integer_abi_cxx11_(&local_2b8,this,loc_01);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,long>
                  (__return_storage_ptr__,(detail *)&local_2b8,rslt_00);
        result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result(&local_2b8);
        local_204 = 1;
        break;
      case floating:
        parse_floating_abi_cxx11_(&local_310,this,loc_01);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,double>
                  (__return_storage_ptr__,(detail *)&local_310,rslt_01);
        result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result(&local_310);
        local_204 = 1;
        break;
      case string:
        parse_string_abi_cxx11_(&local_388,this,loc_01);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::string>
                  (__return_storage_ptr__,(detail *)&local_388,rslt_02);
        result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result(&local_388);
        local_204 = 1;
        break;
      case offset_datetime:
        parse_offset_datetime_abi_cxx11_(&local_3e8,this,loc_01);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::offset_datetime>
                  (__return_storage_ptr__,(detail *)&local_3e8,rslt_03);
        result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result(&local_3e8);
        local_204 = 1;
        break;
      case local_datetime:
        parse_local_datetime_abi_cxx11_(&local_448,this,loc_01);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::local_datetime>
                  (__return_storage_ptr__,(detail *)&local_448,rslt_04);
        result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result(&local_448);
        local_204 = 1;
        break;
      case local_date:
        parse_local_date_abi_cxx11_(&local_4a0,this,loc_01);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::local_date>
                  (__return_storage_ptr__,(detail *)&local_4a0,rslt_05);
        result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result(&local_4a0);
        local_204 = 1;
        break;
      case local_time:
        parse_local_time_abi_cxx11_(&local_500,this,loc_01);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::local_time>
                  (__return_storage_ptr__,(detail *)&local_500,rslt_06);
        result<std::pair<toml::local_time,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result(&local_500);
        local_204 = 1;
        break;
      case array:
        parse_array<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
                  (&local_568,this,(location *)first._M_current,0x2f5150);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::vector<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::allocator<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>
                  (__return_storage_ptr__,(detail *)&local_568,rslt_07);
        result<std::pair<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result(&local_568);
        local_204 = 1;
        break;
      case table:
        parse_inline_table<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
                  ((result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&msg.field_2 + 8),this,(location *)first._M_current,0x2f5150);
        parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::unordered_map<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>>
                  (__return_storage_ptr__,(detail *)(msg.field_2._M_local_buf + 8),rslt_08);
        result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result((result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&msg.field_2 + 8));
        local_204 = 1;
        break;
      default:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_630,"toml::parse_value: unknown token appeared",&local_631);
        local_729 = 1;
        local_6d8 = &local_6d0;
        source_location::source_location(&local_728,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[8],_true>
                  (&local_6d0,&local_728,(char (*) [8])"unknown");
        local_729 = 0;
        local_660 = &local_6d0;
        local_658 = 1;
        std::
        allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(&local_72a);
        __l._M_len = local_658;
        __l._M_array = local_660;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector(&local_650,__l,&local_72a);
        local_748.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_748.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_748.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_748);
        format_underline((string *)local_610,&local_630,&local_650,&local_748,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_748);
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_650);
        std::
        allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator(&local_72a);
        local_810 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_660;
        do {
          local_810 = local_810 + -1;
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(local_810);
        } while (local_810 != &local_6d0);
        source_location::~source_location(&local_728);
        std::__cxx11::string::~string((string *)&local_630);
        std::allocator<char>::~allocator(&local_631);
        local_750 = local_28._M_current;
        location::reset((location *)this,(const_iterator)local_28._M_current);
        err<std::__cxx11::string_const&>(&local_770,(toml *)local_610,v_01);
        result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_770);
        failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~failure(&local_770);
        local_204 = 1;
        std::__cxx11::string::~string((string *)local_610);
      }
    }
    else {
      this_01 = result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::unwrap_err((result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1e0);
      err<std::__cxx11::string_const&>(&local_200,(toml *)this_01,v_00);
      result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_200);
      failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~failure(&local_200);
      local_204 = 1;
    }
    result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~result((result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1e0);
  }
  return __return_storage_ptr__;
}

Assistant:

result<Value, std::string> parse_value(location& loc, const std::size_t n_rec)
{
    const auto first = loc.iter();
    if(first == loc.end())
    {
        return err(format_underline("toml::parse_value: input is empty",
                   {{source_location(loc), ""}}));
    }

    const auto type = guess_value_type(loc);
    if(!type)
    {
        return err(type.unwrap_err());
    }

    switch(type.unwrap())
    {
        case value_t::boolean        : {return parse_value_helper<Value>(parse_boolean(loc)            );}
        case value_t::integer        : {return parse_value_helper<Value>(parse_integer(loc)            );}
        case value_t::floating       : {return parse_value_helper<Value>(parse_floating(loc)           );}
        case value_t::string         : {return parse_value_helper<Value>(parse_string(loc)             );}
        case value_t::offset_datetime: {return parse_value_helper<Value>(parse_offset_datetime(loc)    );}
        case value_t::local_datetime : {return parse_value_helper<Value>(parse_local_datetime(loc)     );}
        case value_t::local_date     : {return parse_value_helper<Value>(parse_local_date(loc)         );}
        case value_t::local_time     : {return parse_value_helper<Value>(parse_local_time(loc)         );}
        case value_t::array          : {return parse_value_helper<Value>(parse_array<Value>(loc, n_rec));}
        case value_t::table          : {return parse_value_helper<Value>(parse_inline_table<Value>(loc, n_rec));}
        default:
        {
            const auto msg = format_underline("toml::parse_value: "
                    "unknown token appeared", {{source_location(loc), "unknown"}});
            loc.reset(first);
            return err(msg);
        }
    }
}